

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLexer.cpp
# Opt level: O0

void __thiscall
TestLexer_TestParenCommaParen_Test::TestBody(TestLexer_TestParenCommaParen_Test *this)

{
  allocator<char> local_161;
  string local_160;
  Token local_140;
  allocator<char> local_111;
  string local_110;
  Token local_f0;
  allocator<char> local_c1;
  string local_c0;
  Token local_a0;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  Lexer lexer;
  TestLexer_TestParenCommaParen_Test *this_local;
  
  lexer._40_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"(,)",&local_61);
  Lexer::Lexer((Lexer *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  Lexer::getToken(&local_a0,(Lexer *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  checkToken(&local_a0,LeftParen,1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  Token::~Token(&local_a0);
  Lexer::getToken(&local_f0,(Lexer *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  checkToken(&local_f0,Comma,1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  Token::~Token(&local_f0);
  Lexer::getToken(&local_140,(Lexer *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
  checkToken(&local_140,RightParen,1,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  Token::~Token(&local_140);
  Lexer::~Lexer((Lexer *)local_40);
  return;
}

Assistant:

TEST(TestLexer, TestParenCommaParen) {
    Lexer lexer("(,)");
    checkToken(lexer.getToken(), TokenType::LeftParen, 1, "");
    checkToken(lexer.getToken(), TokenType::Comma, 1, "");
    checkToken(lexer.getToken(), TokenType::RightParen, 1, "");
}